

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filemgr.cc
# Opt level: O3

void filemgr_alloc_multiple
               (filemgr *file,int nblock,bid_t *begin,bid_t *end,err_log_callback *log_callback)

{
  uint uVar1;
  ulong in_RAX;
  ulong uVar2;
  ssize_t sVar3;
  uint8_t _buf;
  undefined8 uStack_38;
  
  uStack_38 = in_RAX;
  pthread_spin_lock(&file->lock);
  uVar1 = file->blocksize;
  uVar2 = (file->pos).super___atomic_base<unsigned_long>._M_i / (ulong)uVar1;
  *begin = uVar2;
  *end = (uVar2 + (long)nblock) - 1;
  LOCK();
  (file->pos).super___atomic_base<unsigned_long>._M_i =
       (file->pos).super___atomic_base<unsigned_long>._M_i + (ulong)(nblock * uVar1);
  UNLOCK();
  if (global_config.ncacheblock < 1) {
    uStack_38 = uStack_38 & 0xffffffffffffff;
    sVar3 = (*file->ops->pwrite)
                      (file->fd,(void *)((long)&uStack_38 + 7),1,
                       (file->pos).super___atomic_base<unsigned_long>._M_i - 1);
    _log_errno_str(file->ops,log_callback,(fdb_status)sVar3,"WRITE",file->filename);
  }
  pthread_spin_unlock(&file->lock);
  return;
}

Assistant:

void filemgr_alloc_multiple(struct filemgr *file, int nblock, bid_t *begin,
                            bid_t *end, err_log_callback *log_callback)
{
    spin_lock(&file->lock);
    *begin = atomic_get_uint64_t(&file->pos) / file->blocksize;
    *end = *begin + nblock - 1;
    atomic_add_uint64_t(&file->pos, file->blocksize * nblock);

    if (global_config.ncacheblock <= 0) {
        // if block cache is turned off, write the allocated block before use
        uint8_t _buf = 0x0;
        ssize_t rv = file->ops->pwrite(file->fd, &_buf, 1,
                                       atomic_get_uint64_t(&file->pos) - 1);
        _log_errno_str(file->ops, log_callback, (fdb_status) rv, "WRITE", file->filename);
    }
    spin_unlock(&file->lock);
}